

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::updateTabBarShapes(QMainWindowLayout *this)

{
  Shape shape;
  QMainWindowLayout *pQVar1;
  long lVar2;
  QMainWindowLayout *pQVar3;
  QMainWindowLayout *pQVar4;
  long in_FS_OFFSET;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  pQVar3 = (QMainWindowLayout *)&local_48;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 2;
  uStack_44 = 3;
  uStack_40 = 0;
  uStack_3c = 1;
  pQVar4 = this + 0x764;
  for (lVar2 = 0; lVar2 != 0x1c0; lVar2 = lVar2 + 0x70) {
    pQVar1 = pQVar4;
    if (this[0x738] != (QMainWindowLayout)0x0) {
      pQVar1 = pQVar3;
    }
    shape = _q_tb_tabBarShapeFrom(*(TabShape *)(this + 0x774),*(TabPosition *)pQVar1);
    QDockAreaLayoutInfo::setTabBarShape((QDockAreaLayoutInfo *)(this + lVar2 + 0x1e0),shape);
    pQVar3 = pQVar3 + 4;
    pQVar4 = pQVar4 + 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::updateTabBarShapes()
{
#if QT_CONFIG(tabwidget)
    const QTabWidget::TabPosition vertical[] = {
        QTabWidget::West,
        QTabWidget::East,
        QTabWidget::North,
        QTabWidget::South
    };
#else
    const QTabBar::Shape vertical[] = {
        QTabBar::RoundedWest,
        QTabBar::RoundedEast,
        QTabBar::RoundedNorth,
        QTabBar::RoundedSouth
    };
#endif

    QDockAreaLayout &layout = layoutState.dockAreaLayout;

    for (int i = 0; i < QInternal::DockCount; ++i) {
#if QT_CONFIG(tabwidget)
        QTabWidget::TabPosition pos = verticalTabsEnabled ? vertical[i] : tabPositions[i];
        QTabBar::Shape shape = _q_tb_tabBarShapeFrom(_tabShape, pos);
#else
        QTabBar::Shape shape = verticalTabsEnabled ? vertical[i] : QTabBar::RoundedSouth;
#endif
        layout.docks[i].setTabBarShape(shape);
    }
}